

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializeWorldActors(FArchive *arc)

{
  FArchive *pFVar1;
  int iVar2;
  TObjPtr<AActor> *pTVar3;
  long lVar4;
  line_t *plVar5;
  
  if (0 < numsectors) {
    pTVar3 = &sectors->SoundTarget;
    iVar2 = 0;
    do {
      pFVar1 = FArchive::SerializeObject(arc,(DObject **)pTVar3,AActor::RegistrationInfo.MyClass);
      pFVar1 = FArchive::SerializeObject
                         (pFVar1,(DObject **)(pTVar3 + 0x1c),ASectorAction::RegistrationInfo.MyClass
                         );
      pFVar1 = FArchive::SerializeObject
                         (pFVar1,(DObject **)(pTVar3 + 10),DSectorEffect::RegistrationInfo.MyClass);
      pFVar1 = FArchive::SerializeObject
                         (pFVar1,(DObject **)(pTVar3 + 0xb),DSectorEffect::RegistrationInfo.MyClass)
      ;
      FArchive::SerializeObject
                (pFVar1,(DObject **)(pTVar3 + 0xc),DSectorEffect::RegistrationInfo.MyClass);
      iVar2 = iVar2 + 1;
      pTVar3 = pTVar3 + 0x4d;
    } while (iVar2 < numsectors);
  }
  if ((ulong)sectorPortals.Count != 0) {
    pTVar3 = &(sectorPortals.Array)->mSkybox;
    lVar4 = (ulong)sectorPortals.Count << 6;
    do {
      FArchive::SerializeObject(arc,(DObject **)pTVar3,AActor::RegistrationInfo.MyClass);
      pTVar3 = pTVar3 + 8;
      lVar4 = lVar4 + -0x40;
    } while (lVar4 != 0);
  }
  if (0 < numlines) {
    iVar2 = 0;
    plVar5 = lines;
    do {
      lVar4 = 9;
      do {
        if (*(long *)(plVar5->args + lVar4 * 2 + -0xb) != 0) {
          DBaseDecal::SerializeChain
                    (arc,(DBaseDecal **)(*(long *)(plVar5->args + lVar4 * 2 + -0xb) + 8));
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 == 10);
      iVar2 = iVar2 + 1;
      plVar5 = plVar5 + 1;
    } while (iVar2 < numlines);
  }
  return;
}

Assistant:

void P_SerializeWorldActors(FArchive &arc)
{
	int i;
	sector_t *sec;
	line_t *line;

	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->SoundTarget
			<< sec->SecActTarget
			<< sec->floordata
			<< sec->ceilingdata
			<< sec->lightingdata;
	}
	for (auto &s : sectorPortals)
	{
		arc << s.mSkybox;
	}
	for (i = 0, line = lines; i < numlines; i++, line++)
	{
		for (int s = 0; s < 2; s++)
		{
			if (line->sidedef[s] != NULL)
			{
				DBaseDecal::SerializeChain(arc, &line->sidedef[s]->AttachedDecals);
			}
		}
	}
}